

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O2

void __thiscall Assimp::Importer::GetMemoryRequirements(Importer *this,aiMemoryInfo *in)

{
  aiScene *paVar1;
  aiTexture *paVar2;
  aiAnimation *paVar3;
  aiNodeAnim *paVar4;
  aiMaterial *paVar5;
  bool bVar6;
  uint a;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint i;
  aiMesh *paVar10;
  uint p;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  
  if (this->pimpl != (ImporterPimpl *)0x0) {
    in->animations = 0;
    in->cameras = 0;
    in->lights = 0;
    in->total = 0;
    in->textures = 0;
    in->materials = 0;
    in->meshes = 0;
    in->nodes = 0;
    paVar1 = this->pimpl->mScene;
    if (paVar1 != (aiScene *)0x0) {
      in->total = 0x80;
      for (uVar13 = 0; uVar13 < paVar1->mNumMeshes; uVar13 = uVar13 + 1) {
        uVar7 = in->meshes + 0x520;
        in->meshes = uVar7;
        paVar10 = paVar1->mMeshes[uVar13];
        uVar8 = paVar10->mNumVertices;
        if (uVar8 != 0 && paVar10->mVertices != (aiVector3D *)0x0) {
          uVar7 = uVar7 + uVar8 * 0xc;
          in->meshes = uVar7;
          paVar10 = paVar1->mMeshes[uVar13];
          uVar8 = paVar10->mNumVertices;
        }
        if ((paVar10->mNormals != (aiVector3D *)0x0) && (uVar8 != 0)) {
          in->meshes = uVar7 + uVar8 * 0xc;
          paVar10 = paVar1->mMeshes[uVar13];
        }
        bVar6 = aiMesh::HasTangentsAndBitangents(paVar10);
        if (bVar6) {
          in->meshes = in->meshes + paVar1->mMeshes[uVar13]->mNumVertices * 0x18;
        }
        lVar9 = 0;
        while (((lVar9 != 8 && (paVar1->mMeshes[uVar13]->mColors[lVar9] != (aiColor4D *)0x0)) &&
               (uVar8 = paVar1->mMeshes[uVar13]->mNumVertices, uVar8 != 0))) {
          in->meshes = in->meshes + uVar8 * 0x10;
          lVar9 = lVar9 + 1;
        }
        lVar9 = 0;
        while (((paVar10 = paVar1->mMeshes[uVar13], lVar9 != 8 &&
                (paVar10->mTextureCoords[lVar9] != (aiVector3D *)0x0)) &&
               (paVar10->mNumVertices != 0))) {
          in->meshes = in->meshes + paVar10->mNumVertices * 0xc;
          lVar9 = lVar9 + 1;
        }
        uVar8 = in->meshes;
        if (paVar10->mNumBones != 0 && paVar10->mBones != (aiBone **)0x0) {
          uVar8 = uVar8 + paVar10->mNumBones * 8;
          in->meshes = uVar8;
          for (uVar11 = 0; paVar10 = paVar1->mMeshes[uVar13], uVar11 < paVar10->mNumBones;
              uVar11 = uVar11 + 1) {
            in->meshes = uVar8 + 0x460;
            uVar8 = uVar8 + paVar1->mMeshes[uVar13]->mBones[uVar11]->mNumWeights * 8 + 0x460;
            in->meshes = uVar8;
          }
        }
        in->meshes = paVar10->mNumFaces * 0x1c + uVar8;
      }
      uVar8 = in->meshes + in->total;
      in->total = uVar8;
      for (uVar13 = 0; uVar13 < paVar1->mNumTextures; uVar13 = uVar13 + 1) {
        paVar2 = paVar1->mTextures[uVar13];
        uVar7 = in->textures + 0x428;
        in->textures = uVar7;
        if (paVar2->mHeight == 0) {
          uVar12 = paVar2->mWidth;
        }
        else {
          uVar12 = paVar2->mHeight * paVar2->mWidth * 4;
        }
        in->textures = uVar12 + uVar7;
      }
      uVar8 = uVar8 + in->textures;
      in->total = uVar8;
      for (uVar13 = 0; uVar13 < paVar1->mNumAnimations; uVar13 = uVar13 + 1) {
        paVar3 = paVar1->mAnimations[uVar13];
        uVar12 = in->animations + 0x448;
        in->animations = uVar12;
        for (uVar7 = 0; uVar7 < paVar3->mNumChannels; uVar7 = uVar7 + 1) {
          paVar4 = paVar3->mChannels[uVar13];
          in->animations = uVar12 + 0x438;
          uVar12 = uVar12 + paVar4->mNumPositionKeys * 0x18 + 0x438;
          in->animations = uVar12;
          uVar12 = paVar4->mNumScalingKeys * 0x18 + uVar12;
          in->animations = uVar12;
          uVar12 = paVar4->mNumRotationKeys * 0x18 + uVar12;
          in->animations = uVar12;
        }
      }
      uVar8 = uVar8 + in->animations;
      in->total = uVar8;
      uVar7 = paVar1->mNumCameras * 0x438;
      in->cameras = uVar7;
      uVar8 = uVar8 + uVar7;
      in->total = uVar8;
      uVar7 = paVar1->mNumLights * 0x46c;
      in->lights = uVar7;
      in->total = uVar8 + uVar7;
      AddNodeWeight(&in->nodes,paVar1->mRootNode);
      uVar8 = in->total + in->nodes;
      in->total = uVar8;
      for (uVar13 = 0; uVar13 < paVar1->mNumMaterials; uVar13 = uVar13 + 1) {
        paVar5 = paVar1->mMaterials[uVar13];
        uVar7 = in->materials;
        in->materials = uVar7 + 0x10;
        uVar7 = uVar7 + paVar5->mNumAllocated * 8 + 0x10;
        in->materials = uVar7;
        for (uVar11 = 0; uVar11 < paVar5->mNumProperties; uVar11 = uVar11 + 1) {
          uVar7 = uVar7 + paVar5->mProperties[uVar11]->mDataLength;
          in->materials = uVar7;
        }
      }
      in->total = uVar8 + in->materials;
    }
    return;
  }
  __assert_fail("nullptr != pimpl",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Importer.cpp"
                ,0x453,"void Assimp::Importer::GetMemoryRequirements(aiMemoryInfo &) const");
}

Assistant:

void Importer::GetMemoryRequirements(aiMemoryInfo& in) const {
    ai_assert(nullptr != pimpl);
    
    in = aiMemoryInfo();
    aiScene* mScene = pimpl->mScene;

    // return if we have no scene loaded
    if (!pimpl->mScene)
        return;


    in.total = sizeof(aiScene);

    // add all meshes
    for (unsigned int i = 0; i < mScene->mNumMeshes;++i) {
        in.meshes += sizeof(aiMesh);
        if (mScene->mMeshes[i]->HasPositions()) {
            in.meshes += sizeof(aiVector3D) * mScene->mMeshes[i]->mNumVertices;
        }

        if (mScene->mMeshes[i]->HasNormals()) {
            in.meshes += sizeof(aiVector3D) * mScene->mMeshes[i]->mNumVertices;
        }

        if (mScene->mMeshes[i]->HasTangentsAndBitangents()) {
            in.meshes += sizeof(aiVector3D) * mScene->mMeshes[i]->mNumVertices * 2;
        }

        for (unsigned int a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS;++a) {
            if (mScene->mMeshes[i]->HasVertexColors(a)) {
                in.meshes += sizeof(aiColor4D) * mScene->mMeshes[i]->mNumVertices;
            } else {
                break;
            }
        }
        for (unsigned int a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS;++a) {
            if (mScene->mMeshes[i]->HasTextureCoords(a)) {
                in.meshes += sizeof(aiVector3D) * mScene->mMeshes[i]->mNumVertices;
            } else {
                break;
            }
        }
        if (mScene->mMeshes[i]->HasBones()) {
            in.meshes += sizeof(void*) * mScene->mMeshes[i]->mNumBones;
            for (unsigned int p = 0; p < mScene->mMeshes[i]->mNumBones;++p) {
                in.meshes += sizeof(aiBone);
                in.meshes += mScene->mMeshes[i]->mBones[p]->mNumWeights * sizeof(aiVertexWeight);
            }
        }
        in.meshes += (sizeof(aiFace) + 3 * sizeof(unsigned int))*mScene->mMeshes[i]->mNumFaces;
    }
    in.total += in.meshes;

    // add all embedded textures
    for (unsigned int i = 0; i < mScene->mNumTextures;++i) {
        const aiTexture* pc = mScene->mTextures[i];
        in.textures += sizeof(aiTexture);
        if (pc->mHeight) {
            in.textures += 4 * pc->mHeight * pc->mWidth;
        } else {
            in.textures += pc->mWidth;
        }
    }
    in.total += in.textures;

    // add all animations
    for (unsigned int i = 0; i < mScene->mNumAnimations;++i) {
        const aiAnimation* pc = mScene->mAnimations[i];
        in.animations += sizeof(aiAnimation);

        // add all bone anims
        for (unsigned int a = 0; a < pc->mNumChannels; ++a) {
            const aiNodeAnim* pc2 = pc->mChannels[i];
            in.animations += sizeof(aiNodeAnim);
            in.animations += pc2->mNumPositionKeys * sizeof(aiVectorKey);
            in.animations += pc2->mNumScalingKeys * sizeof(aiVectorKey);
            in.animations += pc2->mNumRotationKeys * sizeof(aiQuatKey);
        }
    }
    in.total += in.animations;

    // add all cameras and all lights
    in.total += in.cameras = sizeof(aiCamera) *  mScene->mNumCameras;
    in.total += in.lights  = sizeof(aiLight)  *  mScene->mNumLights;

    // add all nodes
    AddNodeWeight(in.nodes,mScene->mRootNode);
    in.total += in.nodes;

    // add all materials
    for (unsigned int i = 0; i < mScene->mNumMaterials;++i) {
        const aiMaterial* pc = mScene->mMaterials[i];
        in.materials += sizeof(aiMaterial);
        in.materials += pc->mNumAllocated * sizeof(void*);

        for (unsigned int a = 0; a < pc->mNumProperties;++a) {
            in.materials += pc->mProperties[a]->mDataLength;
        }
    }
    in.total += in.materials;
}